

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O0

qint64 __thiscall
QHexView::replace(QHexView *this,QVariant *oldvalue,QVariant *newvalue,qint64 offset,
                 QHexFindMode mode,uint options,QHexFindDirection fd)

{
  QPair<qint64,_qint64> QVar1;
  QVariant local_80;
  QVariant local_60;
  longlong local_40;
  QPair<qint64,_qint64> res;
  uint options_local;
  QHexFindMode mode_local;
  qint64 offset_local;
  QVariant *newvalue_local;
  QVariant *oldvalue_local;
  QHexView *this_local;
  
  res.second._0_4_ = options;
  res.second._4_4_ = mode;
  QVariant::QVariant(&local_60,(QVariant *)oldvalue);
  QVariant::QVariant(&local_80,(QVariant *)newvalue);
  QVar1 = QHexUtils::replace(this,&local_60,&local_80,offset,res.second._4_4_,(uint)res.second,fd);
  res.first = QVar1.second;
  local_40 = QVar1.first;
  QVariant::~QVariant(&local_80);
  QVariant::~QVariant(&local_60);
  if (-1 < local_40) {
    QHexCursor::move(this->m_hexcursor,local_40);
    QHexCursor::selectSize(this->m_hexcursor,res.first);
  }
  return local_40;
}

Assistant:

qint64 QHexView::replace(const QVariant& oldvalue, const QVariant& newvalue,
                         qint64 offset, QHexFindMode mode, unsigned int options,
                         QHexFindDirection fd) const {
    auto res =
        QHexUtils::replace(this, oldvalue, newvalue, offset, mode, options, fd);

    if(res.first > -1) {
        m_hexcursor->move(res.first);
        m_hexcursor->selectSize(res.second);
    }

    return res.first;
}